

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::Eval
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  *this_00;
  bool bVar1;
  Status SVar2;
  bool bVar3;
  ssize_t sVar4;
  const_reference aStr;
  Value *pVVar5;
  size_type sVar6;
  reference importFile;
  pointer ppVar7;
  element_type *peVar8;
  reference pvVar9;
  element_type *peVar10;
  v10 *pvVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar12;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  Value local_f88;
  ErrorCode local_f3c;
  Error local_f38;
  Value local_f10;
  anon_class_1_0_00000001 local_ec2;
  v10 local_ec1;
  v10 *local_ec0;
  size_t local_eb8;
  string local_eb0;
  Error local_e90;
  Value local_e68;
  undefined1 local_e20 [8];
  StringArray unresolved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nwks;
  value_type vStack_de8;
  Status result;
  uint64_t xpan;
  Value local_dd8;
  anon_class_1_0_00000001 local_d8a;
  v10 local_d89;
  v10 *local_d88;
  size_t local_d80;
  string local_d78;
  Error local_d58;
  Value local_d30;
  Value local_ce8;
  ErrorCode local_c9c;
  Error local_c98;
  Value local_c70;
  ErrorCode local_c24;
  Value local_c20;
  undefined1 local_bd8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> nids;
  v10 *local_bb8;
  size_t local_bb0;
  string local_ba8;
  Error local_b88;
  Value local_b60;
  anon_class_1_0_00000001 local_b12;
  v10 local_b11;
  v10 *local_b10;
  char *local_b08;
  string local_b00;
  Error local_ae0;
  Value local_ab8;
  anon_class_1_0_00000001 local_a6a;
  v10 local_a69;
  v10 *local_a68;
  size_t local_a60;
  string local_a58;
  Error local_a38;
  Value local_a10;
  anon_class_1_0_00000001 local_9c2;
  v10 local_9c1;
  v10 *local_9c0;
  char *local_9b8;
  string local_9b0;
  Error local_990;
  Value local_968;
  anon_class_1_0_00000001 local_91a;
  v10 local_919;
  v10 *local_918;
  size_t local_910;
  string local_908;
  Error local_8e8;
  Value local_8c0;
  anon_class_1_0_00000001 local_872;
  v10 local_871;
  v10 *local_870;
  size_t local_868;
  string local_860;
  Error local_840;
  Value local_818;
  ErrorCode local_7cc;
  Error local_7c8;
  Value local_7a0;
  anon_class_1_0_00000001 local_752;
  v10 local_751;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_750;
  char *local_748;
  string local_740;
  Error local_720;
  Value local_6f8;
  _Self local_6b0;
  string local_6a8;
  _Self local_688;
  const_iterator evaluator;
  int cancelData;
  undefined1 local_668 [7];
  bool supported;
  Expression retExpr;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_620 [16];
  v10 *local_610;
  ulong local_608;
  v10 *local_600;
  size_t sStack_5f8;
  string *local_5f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_5e8 [3];
  undefined1 local_5d0 [16];
  v10 *local_5c0;
  ulong local_5b8;
  v10 *local_5b0;
  size_t sStack_5a8;
  string *local_5a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_598 [3];
  undefined1 local_580 [16];
  v10 *local_570;
  ulong local_568;
  v10 *local_560;
  size_t sStack_558;
  string *local_550;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_548 [3];
  undefined1 local_530 [16];
  v10 *local_520;
  ulong local_518;
  v10 *local_510;
  size_t sStack_508;
  string *local_500;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_4f8 [3];
  undefined1 local_4e0 [16];
  v10 *local_4d0;
  ulong local_4c8;
  v10 *local_4c0;
  size_t sStack_4b8;
  string *local_4b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_4a8 [3];
  undefined1 local_490 [16];
  v10 *local_480;
  ulong local_478;
  v10 *local_470;
  size_t sStack_468;
  string *local_460;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_458 [2];
  undefined1 local_448 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  char *local_430;
  const_reference local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  char *pcStack_418;
  string *local_410;
  v10 *local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_400;
  v10 *local_3f8;
  v10 **local_3f0;
  v10 *local_3e8;
  v10 **local_3e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]> *local_3d8 [2]
  ;
  undefined1 local_3c8 [16];
  v10 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  v10 *local_3a0;
  char *pcStack_398;
  string *local_390;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]> *local_388 [3]
  ;
  undefined1 local_370 [16];
  v10 *local_360;
  char *local_358;
  char *local_350;
  v10 *local_348;
  char *pcStack_340;
  string *local_338;
  v10 *local_330;
  v10 **local_328;
  v10 *local_320;
  v10 **local_318;
  v10 *local_310;
  v10 **local_308;
  v10 *local_300;
  v10 **local_2f8;
  v10 *local_2f0;
  v10 **local_2e8;
  v10 *local_2e0;
  v10 **local_2d8;
  v10 **local_2d0;
  v10 *local_2c8;
  size_t sStack_2c0;
  v10 **local_2b0;
  v10 *local_2a8;
  size_t sStack_2a0;
  v10 **local_290;
  v10 *local_288;
  size_t sStack_280;
  v10 **local_270;
  v10 *local_268;
  size_t sStack_260;
  v10 **local_250;
  v10 *local_248;
  size_t sStack_240;
  v10 **local_230;
  v10 *local_228;
  size_t sStack_220;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_210;
  undefined1 *local_208;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_200;
  undefined1 *local_1f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1f0;
  undefined1 *local_1e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1e0;
  undefined1 *local_1d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1d0;
  undefined1 *local_1c8;
  Value **local_1c0;
  undefined1 *local_1b8;
  Value **local_1b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_198;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_190;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_188;
  Value **local_180;
  undefined8 local_178;
  undefined1 *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_168;
  undefined8 local_160;
  undefined1 *local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_150;
  undefined8 local_148;
  undefined1 *local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_138;
  undefined8 local_130;
  undefined1 *local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_120;
  undefined8 local_118;
  undefined1 *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_108;
  undefined8 local_100;
  undefined1 *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  char *pcStack_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_d0;
  undefined1 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]> **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]> **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]> **local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]> **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]> **local_10;
  
  retExpr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aExpr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_668);
  bVar3 = false;
  Value::Value(__return_storage_ptr__);
  std::atomic<bool>::operator=(&this->mCancelCommand,false);
  do {
    sVar4 = read(this->mCancelPipe[0],&evaluator,4);
    this_00 = mEvaluatorMap_abi_cxx11_;
  } while (sVar4 != -1);
  aStr = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)retExpr.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ToLower(&local_6a8,aStr);
  local_688._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
       ::find(this_00,&local_6a8);
  std::__cxx11::string::~string((string *)&local_6a8);
  local_6b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
       ::end(mEvaluatorMap_abi_cxx11_);
  bVar1 = std::operator==(&local_688,&local_6b0);
  if (bVar1) {
    Eval::anon_class_1_0_00000001::operator()(&local_752);
    local_400 = &local_750;
    local_408 = &local_751;
    bVar12 = ::fmt::v10::operator()(local_408);
    local_748 = (char *)bVar12.size_;
    local_750 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar12.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_428 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)retExpr.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_410 = &local_740;
    local_420 = local_750;
    pcStack_418 = local_748;
    local_f0 = &local_420;
    local_438 = local_750;
    local_430 = local_748;
    local_e8 = local_438;
    pcStack_e0 = local_430;
    local_458[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_428,(v10 *)local_410,local_750);
    local_c8 = local_448;
    local_d0 = local_458;
    local_b8 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_430;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_d0;
    local_c0 = local_d0;
    local_b0 = local_c8;
    local_a8 = local_d0;
    ::fmt::v10::vformat_abi_cxx11_(&local_740,(v10 *)local_438,fmt,args);
    Error::Error(&local_720,kInvalidCommand,&local_740);
    Value::Value(&local_6f8,&local_720);
    Value::operator=(__return_storage_ptr__,&local_6f8);
    Value::~Value(&local_6f8);
    Error::~Error(&local_720);
    std::__cxx11::string::~string((string *)&local_740);
  }
  else {
    MultiNetCommandContext::Cleanup(&this->mContext);
    ReParseMultiNetworkSyntax
              (&local_7c8,this,
               (Expression *)
               retExpr.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(Expression *)local_668);
    Value::Value(&local_7a0,&local_7c8);
    pVVar5 = Value::operator=(__return_storage_ptr__,&local_7a0);
    local_7cc = kNone;
    bVar1 = Value::operator!=(pVVar5,&local_7cc);
    Value::~Value(&local_7a0);
    Error::~Error(&local_7c8);
    if (!bVar1) {
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->mContext).mExportFiles);
      if (sVar6 < 2) {
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->mContext).mImportFiles);
        if (sVar6 < 2) {
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->mContext).mExportFiles);
          if (sVar6 == 0) {
            sVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&(this->mContext).mImportFiles);
            if (sVar6 == 0) {
LAB_0025e848:
              sVar6 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this);
              if ((sVar6 == 0) &&
                 (sVar6 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(&(this->mContext).mDomAliases), sVar6 == 0)) {
                sVar6 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&(this->mContext).mImportFiles);
                if (sVar6 != 0) {
                  vStack_de8 = 0;
                  bVar1 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)this);
                  if (bVar1) {
                    peVar8 = std::
                             __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&this->mRegistry);
                    SVar2 = persistent_storage::Registry::GetCurrentNetworkXpan
                                      (peVar8,&stack0xfffffffffffff218);
                    if (SVar2 != kSuccess) {
                      vStack_de8 = 0;
                    }
                  }
                  else {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &unresolved.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_e20);
                    peVar8 = std::
                             __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&this->mRegistry);
                    SVar2 = persistent_storage::Registry::GetNetworkXpansByAliases
                                      (peVar8,(StringArray *)this,
                                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       &unresolved.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (StringArray *)local_e20);
                    if (SVar2 == kSuccess) {
                      pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                               operator[]((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          &unresolved.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
                      vStack_de8 = *pvVar9;
                      xpan._4_4_ = 0;
                    }
                    else {
                      Eval::anon_class_1_0_00000001::operator()(&local_ec2);
                      local_2d8 = &local_ec0;
                      local_2e0 = &local_ec1;
                      bVar12 = ::fmt::v10::operator()(local_2e0);
                      local_eb8 = bVar12.size_;
                      local_ec0 = (v10 *)bVar12.data_;
                      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                      local_5f0 = &local_eb0;
                      local_600 = local_ec0;
                      sStack_5f8 = local_eb8;
                      local_230 = &local_600;
                      local_610 = local_ec0;
                      local_608 = local_eb8;
                      local_228 = local_610;
                      sStack_220 = local_608;
                      value = (Value *)::fmt::v10::
                                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                                 ();
                      local_1b8 = local_620;
                      local_1c0 = &value;
                      local_178 = 0;
                      fmt_07.size_ = 0;
                      fmt_07.data_ = (char *)local_608;
                      args_07.field_1.values_ = in_R9.values_;
                      args_07.desc_ = (unsigned_long_long)local_1c0;
                      local_1b0 = local_1c0;
                      local_180 = local_1c0;
                      local_170 = local_1b8;
                      ::fmt::v10::vformat_abi_cxx11_(&local_eb0,local_610,fmt_07,args_07);
                      Error::Error(&local_e90,kInvalidArgs,&local_eb0);
                      Value::Value(&local_e68,&local_e90);
                      Value::operator=(__return_storage_ptr__,&local_e68);
                      Value::~Value(&local_e68);
                      Error::~Error(&local_e90);
                      std::__cxx11::string::~string((string *)&local_eb0);
                      xpan._4_4_ = 6;
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_e20);
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &unresolved.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (xpan._4_4_ != 0) goto joined_r0x0025ede5;
                  }
                  peVar10 = std::
                            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&this->mJobManager);
                  JobManager::AppendImport(&local_f38,peVar10,vStack_de8,(Expression *)local_668);
                  Value::Value(&local_f10,&local_f38);
                  pVVar5 = Value::operator=(__return_storage_ptr__,&local_f10);
                  local_f3c = kNone;
                  bVar3 = Value::operator!=(pVVar5,&local_f3c);
                  Value::~Value(&local_f10);
                  Error::~Error(&local_f38);
                  if (bVar3) goto LAB_0025f31c;
                }
                ppVar7 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                         ::operator->(&local_688);
                std::
                function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                ::operator()(&local_f88,&ppVar7->second,this,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_668);
                Value::operator=(__return_storage_ptr__,&local_f88);
                Value::~Value(&local_f88);
              }
              else {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bd8);
                ValidateMultiNetworkSyntax
                          (&local_c20,this,(Expression *)local_668,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bd8);
                pVVar5 = Value::operator=(__return_storage_ptr__,&local_c20);
                local_c24 = kNone;
                bVar1 = Value::operator!=(pVVar5,&local_c24);
                Value::~Value(&local_c20);
                if (bVar1) {
                  xpan._4_4_ = 6;
                }
                else {
                  bVar1 = IsMultiJob(this,(Expression *)local_668);
                  if (bVar1) {
                    peVar10 = std::
                              __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)&this->mJobManager);
                    bVar1 = MultiNetCommandContext::HasGroupAlias(&this->mContext);
                    JobManager::PrepareJobs
                              (&local_c98,peVar10,(Expression *)local_668,
                               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bd8,
                               bVar1);
                    Value::Value(&local_c70,&local_c98);
                    pVVar5 = Value::operator=(__return_storage_ptr__,&local_c70);
                    local_c9c = kNone;
                    bVar1 = Value::operator!=(pVVar5,&local_c9c);
                    Value::~Value(&local_c70);
                    Error::~Error(&local_c98);
                    if (!bVar1) {
                      peVar10 = std::
                                __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)&this->mJobManager);
                      JobManager::RunJobs(peVar10);
                      peVar10 = std::
                                __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)&this->mJobManager);
                      JobManager::CollectJobsValue(&local_ce8,peVar10);
                      Value::operator=(__return_storage_ptr__,&local_ce8);
                      Value::~Value(&local_ce8);
                      goto LAB_0025edb4;
                    }
                    xpan._4_4_ = 6;
                  }
                  else {
                    sVar6 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size(&(this->mContext).mImportFiles);
                    if (sVar6 == 0) {
                      ppVar7 = std::
                               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>
                               ::operator->(&local_688);
                      std::
                      function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                      ::operator()(&local_dd8,&ppVar7->second,this,
                                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_668);
                      Value::operator=(__return_storage_ptr__,&local_dd8);
                      Value::~Value(&local_dd8);
LAB_0025edb4:
                      xpan._4_4_ = 0;
                    }
                    else {
                      Eval::anon_class_1_0_00000001::operator()(&local_d8a);
                      local_2e8 = &local_d88;
                      local_2f0 = &local_d89;
                      bVar12 = ::fmt::v10::operator()(local_2f0);
                      local_d80 = bVar12.size_;
                      local_d88 = (v10 *)bVar12.data_;
                      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                      local_5a0 = &local_d78;
                      local_5b0 = local_d88;
                      sStack_5a8 = local_d80;
                      local_250 = &local_5b0;
                      local_5c0 = local_d88;
                      local_5b8 = local_d80;
                      local_248 = local_5c0;
                      sStack_240 = local_5b8;
                      local_5e8[0] = ::fmt::v10::
                                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                               ();
                      local_1c8 = local_5d0;
                      local_1d0 = local_5e8;
                      local_160 = 0;
                      fmt_06.size_ = 0;
                      fmt_06.data_ = (char *)local_5b8;
                      args_06.field_1.values_ = in_R9.values_;
                      args_06.desc_ = (unsigned_long_long)local_1d0;
                      local_1a8 = local_1d0;
                      local_168 = local_1d0;
                      local_158 = local_1c8;
                      ::fmt::v10::vformat_abi_cxx11_(&local_d78,local_5c0,fmt_06,args_06);
                      Error::Error(&local_d58,kInvalidArgs,&local_d78);
                      Value::Value(&local_d30,&local_d58);
                      Value::operator=(__return_storage_ptr__,&local_d30);
                      Value::~Value(&local_d30);
                      Error::~Error(&local_d58);
                      std::__cxx11::string::~string((string *)&local_d78);
                      xpan._4_4_ = 6;
                    }
                  }
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bd8);
                if (xpan._4_4_ != 0) {
joined_r0x0025ede5:
                  if (xpan._4_4_ != 6) goto LAB_0025f347;
                }
              }
            }
            else {
              pvVar11 = mImportSyntax_abi_cxx11_;
              bVar1 = IsFeatureSupported(this,(vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               *)mImportSyntax_abi_cxx11_,(Expression *)local_668);
              if (bVar1) {
                sVar6 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&(this->mContext).mExportFiles);
                if (sVar6 == 0) {
                  peVar10 = std::
                            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)&this->mJobManager);
                  importFile = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::front(&(this->mContext).mImportFiles);
                  JobManager::SetImportFile(peVar10,importFile);
                  goto LAB_0025e848;
                }
                Eval::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           ((long)&nids.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
                local_2f8 = &local_bb8;
                local_300 = (v10 *)((long)&nids.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                bVar12 = ::fmt::v10::operator()(local_300);
                local_bb0 = bVar12.size_;
                local_bb8 = (v10 *)bVar12.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_550 = &local_ba8;
                local_560 = local_bb8;
                sStack_558 = local_bb0;
                local_270 = &local_560;
                local_570 = local_bb8;
                local_568 = local_bb0;
                local_268 = local_570;
                sStack_260 = local_568;
                local_598[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                local_1d8 = local_580;
                local_1e0 = local_598;
                local_148 = 0;
                fmt_05.size_ = 0;
                fmt_05.data_ = (char *)local_568;
                args_05.field_1.values_ = in_R9.values_;
                args_05.desc_ = (unsigned_long_long)local_1e0;
                local_1a0 = local_1e0;
                local_150 = local_1e0;
                local_140 = local_1d8;
                ::fmt::v10::vformat_abi_cxx11_(&local_ba8,local_570,fmt_05,args_05);
                Error::Error(&local_b88,kInvalidArgs,&local_ba8);
                Value::Value(&local_b60,&local_b88);
                Value::operator=(__return_storage_ptr__,&local_b60);
                Value::~Value(&local_b60);
                Error::~Error(&local_b88);
                std::__cxx11::string::~string((string *)&local_ba8);
              }
              else {
                Eval::anon_class_1_0_00000001::operator()(&local_b12);
                local_308 = &local_b10;
                local_310 = &local_b11;
                bVar12 = ::fmt::v10::operator()(local_310);
                local_b08 = (char *)bVar12.size_;
                local_b10 = (v10 *)bVar12.data_;
                ::fmt::v10::detail::check_format_string<const_char_(&)[9],_FMT_COMPILE_STRING,_0>();
                local_390 = &local_b00;
                local_3a0 = local_b10;
                pcStack_398 = local_b08;
                local_3a8 = "--import";
                local_80 = &local_3a0;
                local_3b8 = local_b10;
                local_3b0 = local_b08;
                local_78 = local_3b8;
                pcStack_70 = local_3b0;
                local_3d8[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[9]>
                                         ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]>
                                           *)0x3ae3c1,pvVar11,(char (*) [9])local_390);
                local_30 = local_3c8;
                local_38 = local_3d8;
                local_20 = 0xc;
                fmt_04.size_ = 0xc;
                fmt_04.data_ = local_3b0;
                args_04.field_1.values_ = in_R9.values_;
                args_04.desc_ = (unsigned_long_long)local_38;
                local_28 = local_38;
                local_18 = local_30;
                local_10 = local_38;
                ::fmt::v10::vformat_abi_cxx11_(&local_b00,local_3b8,fmt_04,args_04);
                Error::Error(&local_ae0,kInvalidArgs,&local_b00);
                Value::Value(&local_ab8,&local_ae0);
                Value::operator=(__return_storage_ptr__,&local_ab8);
                Value::~Value(&local_ab8);
                Error::~Error(&local_ae0);
                std::__cxx11::string::~string((string *)&local_b00);
              }
            }
          }
          else {
            pvVar11 = mExportSyntax_abi_cxx11_;
            bVar1 = IsFeatureSupported(this,(vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             *)mExportSyntax_abi_cxx11_,(Expression *)local_668);
            if (bVar1) {
              sVar6 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(&(this->mContext).mImportFiles);
              if (sVar6 == 0) goto LAB_0025e848;
              Eval::anon_class_1_0_00000001::operator()(&local_a6a);
              local_318 = &local_a68;
              local_320 = &local_a69;
              bVar12 = ::fmt::v10::operator()(local_320);
              local_a60 = bVar12.size_;
              local_a68 = (v10 *)bVar12.data_;
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              local_500 = &local_a58;
              local_510 = local_a68;
              sStack_508 = local_a60;
              local_290 = &local_510;
              local_520 = local_a68;
              local_518 = local_a60;
              local_288 = local_520;
              sStack_280 = local_518;
              local_548[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                       ();
              local_1e8 = local_530;
              local_1f0 = local_548;
              local_130 = 0;
              fmt_03.size_ = 0;
              fmt_03.data_ = (char *)local_518;
              args_03.field_1.values_ = in_R9.values_;
              args_03.desc_ = (unsigned_long_long)local_1f0;
              local_198 = local_1f0;
              local_138 = local_1f0;
              local_128 = local_1e8;
              ::fmt::v10::vformat_abi_cxx11_(&local_a58,local_520,fmt_03,args_03);
              Error::Error(&local_a38,kInvalidArgs,&local_a58);
              Value::Value(&local_a10,&local_a38);
              Value::operator=(__return_storage_ptr__,&local_a10);
              Value::~Value(&local_a10);
              Error::~Error(&local_a38);
              std::__cxx11::string::~string((string *)&local_a58);
            }
            else {
              Eval::anon_class_1_0_00000001::operator()(&local_9c2);
              local_328 = &local_9c0;
              local_330 = &local_9c1;
              bVar12 = ::fmt::v10::operator()(local_330);
              local_9b8 = (char *)bVar12.size_;
              local_9c0 = (v10 *)bVar12.data_;
              ::fmt::v10::detail::check_format_string<const_char_(&)[9],_FMT_COMPILE_STRING,_0>();
              local_338 = &local_9b0;
              local_348 = local_9c0;
              pcStack_340 = local_9b8;
              local_350 = "--export";
              local_a0 = &local_348;
              local_360 = local_9c0;
              local_358 = local_9b8;
              local_98 = local_360;
              pcStack_90 = local_358;
              local_388[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[9]>
                                       ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[9]>
                                         *)0x3ae399,pvVar11,(char (*) [9])local_338);
              local_60 = local_370;
              local_68 = local_388;
              local_50 = 0xc;
              fmt_02.size_ = 0xc;
              fmt_02.data_ = local_358;
              args_02.field_1.values_ = in_R9.values_;
              args_02.desc_ = (unsigned_long_long)local_68;
              local_58 = local_68;
              local_48 = local_60;
              local_40 = local_68;
              ::fmt::v10::vformat_abi_cxx11_(&local_9b0,local_360,fmt_02,args_02);
              Error::Error(&local_990,kInvalidArgs,&local_9b0);
              Value::Value(&local_968,&local_990);
              Value::operator=(__return_storage_ptr__,&local_968);
              Value::~Value(&local_968);
              Error::~Error(&local_990);
              std::__cxx11::string::~string((string *)&local_9b0);
            }
          }
        }
        else {
          Eval::anon_class_1_0_00000001::operator()(&local_91a);
          local_3e0 = &local_918;
          local_3e8 = &local_919;
          bVar12 = ::fmt::v10::operator()(local_3e8);
          local_910 = bVar12.size_;
          local_918 = (v10 *)bVar12.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_4b0 = &local_908;
          local_4c0 = local_918;
          sStack_4b8 = local_910;
          local_2b0 = &local_4c0;
          local_4d0 = local_918;
          local_4c8 = local_910;
          local_2a8 = local_4d0;
          sStack_2a0 = local_4c8;
          local_4f8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_1f8 = local_4e0;
          local_200 = local_4f8;
          local_118 = 0;
          fmt_01.size_ = 0;
          fmt_01.data_ = (char *)local_4c8;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_200;
          local_190 = local_200;
          local_120 = local_200;
          local_110 = local_1f8;
          ::fmt::v10::vformat_abi_cxx11_(&local_908,local_4d0,fmt_01,args_01);
          Error::Error(&local_8e8,kInvalidArgs,&local_908);
          Value::Value(&local_8c0,&local_8e8);
          Value::operator=(__return_storage_ptr__,&local_8c0);
          Value::~Value(&local_8c0);
          Error::~Error(&local_8e8);
          std::__cxx11::string::~string((string *)&local_908);
        }
      }
      else {
        Eval::anon_class_1_0_00000001::operator()(&local_872);
        local_3f0 = &local_870;
        local_3f8 = &local_871;
        bVar12 = ::fmt::v10::operator()(local_3f8);
        local_868 = bVar12.size_;
        local_870 = (v10 *)bVar12.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_460 = &local_860;
        local_470 = local_870;
        sStack_468 = local_868;
        local_2d0 = &local_470;
        local_480 = local_870;
        local_478 = local_868;
        local_2c8 = local_480;
        sStack_2c0 = local_478;
        local_4a8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_208 = local_490;
        local_210 = local_4a8;
        local_100 = 0;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_478;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_210;
        local_188 = local_210;
        local_108 = local_210;
        local_f8 = local_208;
        ::fmt::v10::vformat_abi_cxx11_(&local_860,local_480,fmt_00,args_00);
        Error::Error(&local_840,kInvalidArgs,&local_860);
        Value::Value(&local_818,&local_840);
        Value::operator=(__return_storage_ptr__,&local_818);
        Value::~Value(&local_818);
        Error::~Error(&local_840);
        std::__cxx11::string::~string((string *)&local_860);
      }
    }
  }
LAB_0025f31c:
  peVar10 = std::
            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mJobManager);
  JobManager::CleanupJobs(peVar10);
  bVar3 = true;
  xpan._4_4_ = 1;
LAB_0025f347:
  if (!bVar3) {
    Value::~Value(__return_storage_ptr__);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_668);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::Eval(const Expression &aExpr)
{
    Expression retExpr;
    bool       supported;
    Value      value;
    int        cancelData;

    mCancelCommand = false;
    // empty the pipe prior to starting command execution
    while (read(mCancelPipe[0], &cancelData, sizeof(cancelData)) != -1)
        ;

    // make sure first the command is known
    auto evaluator = mEvaluatorMap.find(ToLower(aExpr.front()));
    if (evaluator == mEvaluatorMap.end())
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_COMMAND, aExpr.front()));
    }
    // prepare for parsing next command
    mContext.Cleanup();

    SuccessOrExit(value = ReParseMultiNetworkSyntax(aExpr, retExpr));
    // export file specification must be single or omitted
    VerifyOrExit(mContext.mExportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_EXPORT));
    // import file specification must be single or omitted
    VerifyOrExit(mContext.mImportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_IMPORT));

    if (mContext.mExportFiles.size() > 0)
    {
        supported = IsFeatureSupported(mExportSyntax, retExpr);
        VerifyOrExit(supported, value = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_EXPORT));
        // export and import must not be specified simultaneously
        VerifyOrExit(mContext.mImportFiles.size() == 0, value = ERROR_INVALID_ARGS(SYNTAX_EXP_IMP_MUTUAL));
    }
    else if (mContext.mImportFiles.size() > 0)
    {
        supported = IsFeatureSupported(mImportSyntax, retExpr);
        VerifyOrExit(supported, value = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_IMPORT));
        // export and import must not be specified simultaneously
        VerifyOrExit(mContext.mExportFiles.size() == 0, value = ERROR_INVALID_ARGS(SYNTAX_EXP_IMP_MUTUAL));
        // let job manager take care of import data
        mJobManager->SetImportFile(mContext.mImportFiles.front());
    }

    if (mContext.mNwkAliases.size() > 0 || mContext.mDomAliases.size() > 0)
    {
        std::vector<uint64_t> nids;

        SuccessOrExit(value = ValidateMultiNetworkSyntax(retExpr, nids));
        if (IsMultiJob(retExpr)) // asynchronous processing required
        {
            SuccessOrExit(value = mJobManager->PrepareJobs(retExpr, nids, mContext.HasGroupAlias()));
            mJobManager->RunJobs();
            value = mJobManager->CollectJobsValue();
        }
        else // synchronous processing possible
        {
            // with multi-network syntax in effect an import semantics
            // is allowed for job-based processing only (see mImportSyntax)
            VerifyOrExit(mContext.mImportFiles.size() == 0,
                         value = ERROR_INVALID_ARGS(
                             "Import syntax is not supported in synchronous processing of multi-network command"));

            value = evaluator->second(this, retExpr);
        }
    }
    else
    {
        // handle single command using selected network
        if (mContext.mImportFiles.size() > 0)
        {
            uint64_t xpan = 0;
            if (mContext.mNwkAliases.empty())
            {
                auto result = mRegistry->GetCurrentNetworkXpan(xpan);
                if (result != Registry::Status::kSuccess)
                {
                    xpan = 0;
                }
            }
            else
            {
                std::vector<uint64_t> nwks;
                StringArray           unresolved;
                VerifyOrExit(mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, nwks, unresolved) ==
                                 Registry::Status::kSuccess,
                             value = ERROR_INVALID_ARGS("Failed to resolve network alias for import"));
                xpan = nwks[0];
            }
            SuccessOrExit(value = mJobManager->AppendImport(xpan, retExpr));
        }
        value = evaluator->second(this, retExpr);
    }
exit:
    // It is necessary to cleanup import file anyways
    mJobManager->CleanupJobs();
    return value;
}